

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::VariableDimensionSyntax::setChild
          (VariableDimensionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined8 uVar2;
  Token TVar3;
  long lStack_20;
  
  if (index == 2) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar1 = (SyntaxNode *)TVar3.info;
    uVar2 = TVar3._0_8_;
    (this->closeBracket).kind = (short)uVar2;
    (this->closeBracket).field_0x2 = (char)((ulong)uVar2 >> 0x10);
    (this->closeBracket).numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
    (this->closeBracket).rawLen = (int)((ulong)uVar2 >> 0x20);
    lStack_20 = 0x38;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    lStack_20 = 0x28;
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar1 = (SyntaxNode *)TVar3.info;
    uVar2 = TVar3._0_8_;
    (this->openBracket).kind = (short)uVar2;
    (this->openBracket).field_0x2 = (char)((ulong)uVar2 >> 0x10);
    (this->openBracket).numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
    (this->openBracket).rawLen = (int)((ulong)uVar2 >> 0x20);
    lStack_20 = 0x20;
  }
  *(SyntaxNode **)((long)&(this->super_SyntaxNode).kind + lStack_20) = pSVar1;
  return;
}

Assistant:

void VariableDimensionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBracket = child.token(); return;
        case 1: specifier = child.node() ? &child.node()->as<DimensionSpecifierSyntax>() : nullptr; return;
        case 2: closeBracket = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}